

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImDrawCmd *pIVar4;
  ImTextureID pvVar5;
  ImDrawCallback p_Var6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImDrawCmd *pIVar14;
  int iVar15;
  int iVar16;
  
  iVar2 = this->Size;
  if (iVar2 == 0) {
    if (this->Capacity == 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar14 = (ImDrawCmd *)(*GImAllocatorAllocFunc)(0x1c0,GImAllocatorUserData);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar14,this->Data,(long)this->Size * 0x38);
        pIVar4 = this->Data;
        if ((pIVar4 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      this->Data = pIVar14;
      this->Capacity = 8;
    }
    pIVar14 = this->Data + this->Size;
  }
  else {
    iVar3 = this->Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar15 = 8;
      }
      else {
        iVar15 = iVar3 / 2 + iVar3;
      }
      iVar16 = iVar2 + 1;
      if (iVar2 + 1 < iVar15) {
        iVar16 = iVar15;
      }
      if (iVar3 < iVar16) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar14 = (ImDrawCmd *)(*GImAllocatorAllocFunc)((long)iVar16 * 0x38,GImAllocatorUserData);
        if (this->Data != (ImDrawCmd *)0x0) {
          memcpy(pIVar14,this->Data,(long)this->Size * 0x38);
          pIVar4 = this->Data;
          if ((pIVar4 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        this->Data = pIVar14;
        this->Capacity = iVar16;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size * 0x38);
    }
    pIVar14 = this->Data;
  }
  pIVar14->UserCallbackData = v->UserCallbackData;
  fVar10 = (v->ClipRect).x;
  fVar11 = (v->ClipRect).y;
  fVar12 = (v->ClipRect).z;
  fVar13 = (v->ClipRect).w;
  pvVar5 = v->TextureId;
  uVar8 = v->VtxOffset;
  uVar9 = v->IdxOffset;
  uVar7 = *(undefined4 *)&v->field_0x24;
  p_Var6 = v->UserCallback;
  pIVar14->ElemCount = v->ElemCount;
  *(undefined4 *)&pIVar14->field_0x24 = uVar7;
  pIVar14->UserCallback = p_Var6;
  pIVar14->TextureId = pvVar5;
  pIVar14->VtxOffset = uVar8;
  pIVar14->IdxOffset = uVar9;
  (pIVar14->ClipRect).x = fVar10;
  (pIVar14->ClipRect).y = fVar11;
  (pIVar14->ClipRect).z = fVar12;
  (pIVar14->ClipRect).w = fVar13;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }